

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O0

IOStream * __thiscall
Assimp::DefaultIOSystem::Open(DefaultIOSystem *this,char *strFile,char *strMode)

{
  FILE *pFile;
  char *__s;
  DefaultIOStream *this_00;
  allocator<char> local_51;
  string local_50;
  FILE *local_30;
  FILE *file;
  char *strMode_local;
  char *strFile_local;
  DefaultIOSystem *this_local;
  
  file = (FILE *)strMode;
  strMode_local = strFile;
  strFile_local = (char *)this;
  local_30 = fopen(strFile,strMode);
  if (local_30 == (FILE *)0x0) {
    this_local = (DefaultIOSystem *)0x0;
  }
  else {
    this_00 = (DefaultIOStream *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x38,(size_t)strMode);
    __s = strMode_local;
    pFile = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    DefaultIOStream::DefaultIOStream(this_00,(FILE *)pFile,&local_50);
    this_local = (DefaultIOSystem *)this_00;
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return (IOStream *)this_local;
}

Assistant:

IOStream* DefaultIOSystem::Open(const char* strFile, const char* strMode)
{
    ai_assert(strFile != nullptr);
    ai_assert(strMode != nullptr);
    FILE* file;
#ifdef _WIN32
    file = ::_wfopen(Utf8ToWide(strFile).c_str(), Utf8ToWide(strMode).c_str());
#else
    file = ::fopen(strFile, strMode);
#endif
    if (!file)
        return nullptr;

    return new DefaultIOStream(file, strFile);
}